

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_fill(resampler *r)

{
  bool bVar1;
  float *pfVar2;
  resampler *in_RDI;
  int write_extra_1;
  float *out_;
  int write_extra;
  int used;
  float *out;
  int write_size;
  int write_pos;
  int quality;
  int min_filled;
  float *in_stack_00000060;
  float **in_stack_00000068;
  resampler *in_stack_00000070;
  resampler *in_stack_00000078;
  float *in_stack_00000088;
  float **in_stack_00000090;
  resampler *in_stack_00000098;
  float *in_stack_000000b0;
  float **in_stack_000000b8;
  resampler *in_stack_000000c0;
  float *in_stack_000000d0;
  float **in_stack_000000d8;
  resampler *in_stack_000000e0;
  int local_34;
  int local_28;
  int local_24;
  float *local_20;
  int local_18;
  int local_14;
  uint local_10;
  int local_c;
  resampler *local_8;
  
  local_8 = in_RDI;
  local_c = resampler_min_filled(in_RDI);
  local_10 = (uint)local_8->quality;
  do {
    bVar1 = false;
    if (local_c < local_8->write_filled) {
      bVar1 = local_8->read_filled < 0x40;
    }
    if (!bVar1) {
      return;
    }
    local_14 = (local_8->read_pos + local_8->read_filled) % 0x40;
    local_18 = 0x40 - local_14;
    pfVar2 = local_8->buffer_out + local_14;
    if (0x40 - local_8->read_filled < local_18) {
      local_18 = 0x40 - local_8->read_filled;
    }
    local_20 = pfVar2;
    switch(local_10) {
    case 0:
      resampler_run_zoh(local_8,&local_20,pfVar2 + local_18);
      break;
    case 1:
      local_28 = 0;
      if (local_8->read_pos <= local_14) {
        local_28 = local_8->read_pos;
      }
      if (0x1f < local_28) {
        local_28 = 0x1f;
      }
      memcpy(local_8->buffer_out + 0x40,local_8->buffer_out,(long)local_28 << 2);
      if (resampler_has_sse == 0) {
        local_24 = resampler_run_blep(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
      }
      else {
        local_24 = resampler_run_blep_sse
                             (in_stack_00000078,(float **)in_stack_00000070,
                              (float *)in_stack_00000068);
      }
      memcpy(local_8->buffer_out,local_8->buffer_out + 0x40,(long)local_28 << 2);
      if (local_24 == 0) {
        return;
      }
      break;
    case 2:
      resampler_run_linear(local_8,&local_20,pfVar2 + local_18);
      break;
    case 3:
      local_34 = 0;
      if (local_8->read_pos <= local_14) {
        local_34 = local_8->read_pos;
      }
      if (0x1f < local_34) {
        local_34 = 0x1f;
      }
      memcpy(local_8->buffer_out + 0x40,local_8->buffer_out,(long)local_34 << 2);
      if (resampler_has_sse == 0) {
        resampler_run_blam(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
      }
      else {
        resampler_run_blam_sse(in_stack_00000098,in_stack_00000090,in_stack_00000088);
      }
      memcpy(local_8->buffer_out,local_8->buffer_out + 0x40,(long)local_34 << 2);
      if (local_20 == pfVar2) {
        return;
      }
      break;
    case 4:
      if (resampler_has_sse == 0) {
        resampler_run_cubic(local_8,&local_20,pfVar2 + local_18);
      }
      else {
        resampler_run_cubic_sse(local_8,&local_20,pfVar2 + local_18);
      }
      break;
    case 5:
      if (resampler_has_sse == 0) {
        resampler_run_sinc(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
      }
      else {
        resampler_run_sinc_sse(in_stack_00000070,in_stack_00000068,in_stack_00000060);
      }
    }
    local_8->read_filled =
         ((int)((long)local_20 - (long)local_8->buffer_out >> 2) - local_14) + local_8->read_filled;
  } while( true );
}

Assistant:

static void resampler_fill(resampler * r)
{
    int min_filled = resampler_min_filled(r);
    int quality = r->quality;
    while ( r->write_filled > min_filled &&
            r->read_filled < resampler_buffer_size )
    {
        int write_pos = ( r->read_pos + r->read_filled ) % resampler_buffer_size;
        int write_size = resampler_buffer_size - write_pos;
        float * out = r->buffer_out + write_pos;
        if ( write_size > ( resampler_buffer_size - r->read_filled ) )
            write_size = resampler_buffer_size - r->read_filled;
        switch (quality)
        {
        case RESAMPLER_QUALITY_ZOH:
            resampler_run_zoh( r, &out, out + write_size );
            break;
                
        case RESAMPLER_QUALITY_BLEP:
        {
            int used;
            int write_extra = 0;
            if ( write_pos >= r->read_pos )
                write_extra = r->read_pos;
            if ( write_extra > SINC_WIDTH * 2 - 1 )
                write_extra = SINC_WIDTH * 2 - 1;
            memcpy( r->buffer_out + resampler_buffer_size, r->buffer_out, write_extra * sizeof(r->buffer_out[0]) );
#ifdef RESAMPLER_SSE
            if ( resampler_has_sse )
                used = resampler_run_blep_sse( r, &out, out + write_size + write_extra );
            else
#endif
                used = resampler_run_blep( r, &out, out + write_size + write_extra );
            memcpy( r->buffer_out, r->buffer_out + resampler_buffer_size, write_extra * sizeof(r->buffer_out[0]) );
            if (!used)
                return;
            break;
        }
                
        case RESAMPLER_QUALITY_LINEAR:
            resampler_run_linear( r, &out, out + write_size );
            break;
                
        case RESAMPLER_QUALITY_BLAM:
        {
            float * out_ = out;
            int write_extra = 0;
            if ( write_pos >= r->read_pos )
                write_extra = r->read_pos;
            if ( write_extra > SINC_WIDTH * 2 - 1 )
                write_extra = SINC_WIDTH * 2 - 1;
            memcpy( r->buffer_out + resampler_buffer_size, r->buffer_out, write_extra * sizeof(r->buffer_out[0]) );
#ifdef RESAMPLER_SSE
            if ( resampler_has_sse )
                resampler_run_blam_sse( r, &out, out + write_size + write_extra );
            else
#endif
                resampler_run_blam( r, &out, out + write_size + write_extra );
            memcpy( r->buffer_out, r->buffer_out + resampler_buffer_size, write_extra * sizeof(r->buffer_out[0]) );
            if ( out == out_ )
                return;
            break;
        }

        case RESAMPLER_QUALITY_CUBIC:
#ifdef RESAMPLER_SSE
            if ( resampler_has_sse )
                resampler_run_cubic_sse( r, &out, out + write_size );
            else
#endif
                resampler_run_cubic( r, &out, out + write_size );
            break;
                
        case RESAMPLER_QUALITY_SINC:
#ifdef RESAMPLER_SSE
            if ( resampler_has_sse )
                resampler_run_sinc_sse( r, &out, out + write_size );
            else
#endif
                resampler_run_sinc( r, &out, out + write_size );
            break;
        }
        r->read_filled += (int)(out - r->buffer_out - write_pos);
    }
}